

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O0

void __thiscall level_mesh::restore_game_materials(level_mesh *this,xr_cform *cform)

{
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  size_type __n;
  cf_vertex_vec *this_00;
  const_reference pvVar5;
  cf_face_vec *pcVar6;
  pointer pcVar7;
  reference p0;
  reference p1;
  reference p2;
  _vector3<float> *__x;
  size_type sVar8;
  _vector2<float> *p_Var9;
  pointer pbVar10;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_e0;
  b_face_vec_it end_1;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_d0;
  b_face_vec_it it_1;
  _vector2<float> local_bc;
  _vector2<float> local_b4;
  uint32_t local_ac;
  undefined1 local_a8 [4];
  uint32_t tc_base;
  uint local_9c;
  undefined4 local_98;
  uint32_t vxm;
  uint32_t VF_SHARED;
  uint32_t vx;
  uint32_t i;
  uint ghost;
  cf_face_vec_cit end;
  cf_face_vec_cit it;
  cf_vertex *verts;
  size_t num_faces;
  size_t num_normals;
  b_face face_template;
  uint32_t *cf2m;
  xr_cform *cform_local;
  level_mesh *this_local;
  
  face_template._56_8_ = remap_cform_verts(this,cform);
  match_edges_faces(this,cform,(uint32_t *)face_template._56_8_);
  propagate_gamemtls(this);
  xray_re::msg("restoring fake colliders");
  xray_re::xr_mesh_builder::b_face::b_face((b_face *)&num_normals);
  sVar4 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&(this->super_xr_mesh_builder).m_normals);
  __n = std::
        vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
        ::size(&(this->super_xr_mesh_builder).m_faces);
  this_00 = xray_re::xr_cform::vertices(cform);
  pvVar5 = std::vector<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>::operator[]
                     (this_00,0);
  pcVar6 = xray_re::xr_cform::faces(cform);
  end._M_current =
       (cf_face *)std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::begin(pcVar6);
  pcVar6 = xray_re::xr_cform::faces(cform);
  _i = std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>::end(pcVar6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<const_xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
                                  *)&i), bVar2) {
    vx = 0;
    VF_SHARED = 3;
    while (uVar1 = face_template._56_8_, VF_SHARED != 0) {
      local_98 = 0x80000000;
      pcVar7 = __gnu_cxx::
               __normal_iterator<const_xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end);
      VF_SHARED = VF_SHARED - 1;
      vxm = *(uint *)((long)&pcVar7->field_0 + (ulong)VF_SHARED * 4);
      local_9c = *(uint *)(uVar1 + (ulong)vxm * 4);
      if (local_9c == 0xffffffff) {
        sVar8 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
                size(&(this->super_xr_mesh_builder).super_xr_mesh.m_points);
        local_9c = (uint)sVar8;
        std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
                  (&(this->super_xr_mesh_builder).super_xr_mesh.m_points,&pvVar5[vxm].p);
        *(uint *)(face_template._56_8_ + (ulong)vxm * 4) = local_9c | 0x80000000;
        vx = vx + 1;
      }
      else if ((local_9c & 0x80000000) != 0) {
        local_9c = local_9c & 0x7fffffff;
        vx = vx + 1;
      }
      *(uint *)((long)&num_normals + (ulong)VF_SHARED * 4) = local_9c;
    }
    if (vx != 0) {
      face_template.field_0.field_0.tc[0] = 0;
      face_template.field_0.field_0.n[2] = 0;
      face_template.field_0.field_0.n[1] = 0;
      sVar8 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
              size(&(this->super_xr_mesh_builder).m_normals);
      face_template.field_0.field_0.v[1] = (uint32_t)sVar8;
      face_template.field_0.field_0.v[2] = face_template.field_0.field_0.v[1];
      face_template.field_0.field_0.n[0] = face_template.field_0.field_0.v[1];
      pcVar7 = __gnu_cxx::
               __normal_iterator<const_xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end);
      face_template.field_1.field_1.sgroup._2_2_ = (undefined2)((pcVar7->field_1).dummy >> 0x10);
      pcVar7 = __gnu_cxx::
               __normal_iterator<const_xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
               ::operator->(&end);
      xray_re::xr_raw_surface::set
                ((xr_raw_surface *)((long)&face_template.field_0 + 0x28),0,0,
                 (ushort)(pcVar7->field_1).dummy & 0x3fff,0x11);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      push_back(&(this->super_xr_mesh_builder).m_faces,(value_type *)&num_normals);
      memset(local_a8,0,0xc);
      p0 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,(ulong)(uint)num_normals
                     );
      p1 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,(ulong)num_normals._4_4_
                     );
      p2 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
           operator[](&(this->super_xr_mesh_builder).super_xr_mesh.m_points,
                      (ulong)face_template.field_0.field_0.v[0]);
      __x = xray_re::_vector3<float>::calc_normal((_vector3<float> *)local_a8,p0,p1,p2);
      std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
                (&(this->super_xr_mesh_builder).m_normals,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_xray_re::cf_face_*,_std::vector<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>_>
    ::operator++(&end);
  }
  if (face_template._56_8_ != 0) {
    operator_delete__((void *)face_template._56_8_);
  }
  sVar8 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::size
                    (&(this->super_xr_mesh_builder).m_normals);
  if (sVar4 != sVar8) {
    xray_re::xr_mesh_builder::remove_back_faces(&this->super_xr_mesh_builder,0.001);
    sVar8 = std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::size
                      (&(this->super_xr_mesh_builder).m_texcoords);
    local_ac = (uint32_t)sVar8;
    memset(&local_b4,0,8);
    p_Var9 = xray_re::_vector2<float>::set(&local_b4,0.0,0.0);
    std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
              (&(this->super_xr_mesh_builder).m_texcoords,p_Var9);
    memset(&local_bc,0,8);
    p_Var9 = xray_re::_vector2<float>::set(&local_bc,0.0,1.0);
    std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
              (&(this->super_xr_mesh_builder).m_texcoords,p_Var9);
    memset((void *)((long)&it_1._M_current + 4),0,8);
    p_Var9 = xray_re::_vector2<float>::set((_vector2<float> *)((long)&it_1._M_current + 4),1.0,0.0);
    std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::push_back
              (&(this->super_xr_mesh_builder).m_texcoords,p_Var9);
    end_1._M_current =
         (b_face *)
         std::
         vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
         ::begin(&(this->super_xr_mesh_builder).m_faces);
    local_d0 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator+(&end_1,__n);
    local_e0._M_current =
         (b_face *)
         std::
         vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
         ::end(&(this->super_xr_mesh_builder).m_faces);
    while (bVar2 = __gnu_cxx::operator!=(&local_d0,&local_e0), bVar2) {
      pbVar10 = __gnu_cxx::
                __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                ::operator->(&local_d0);
      uVar3 = local_ac;
      if (sVar4 <= (pbVar10->field_0).field_0.n[0]) {
        pbVar10 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                  ::operator->(&local_d0);
        (pbVar10->field_0).field_0.tc[0] = uVar3;
        uVar3 = local_ac + 1;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                  ::operator->(&local_d0);
        (pbVar10->field_0).field_0.tc[1] = uVar3;
        uVar3 = local_ac + 2;
        pbVar10 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                  ::operator->(&local_d0);
        (pbVar10->field_0).field_0.tc[2] = uVar3;
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
      ::operator++(&local_d0);
    }
  }
  return;
}

Assistant:

void level_mesh::restore_game_materials(const xr_cform& cform)
{
	uint32_t* cf2m = remap_cform_verts(cform);
	match_edges_faces(cform, cf2m);
	propagate_gamemtls();

	msg("restoring fake colliders");
	b_face face_template;
	size_t num_normals = m_normals.size(), num_faces = m_faces.size();
	const cf_vertex* verts = &cform.vertices()[0];
	for (cf_face_vec_cit it = cform.faces().begin(), end = cform.faces().end(); it != end; ++it) {
		unsigned ghost = 0;
		for (uint32_t i = 3, vx; i != 0;) {
			const uint32_t VF_SHARED = 0x80000000;
			uint32_t vxm = cf2m[vx = it->v[--i]];
			if (vxm == BAD_IDX) {
				vxm = uint32_t(m_points.size() & UINT32_MAX);
				m_points.push_back(verts[vx].p);
				cf2m[vx] = vxm | VF_SHARED;
				++ghost;
			} else if (vxm & VF_SHARED) {
				vxm &= ~VF_SHARED;
				++ghost;
			}
			face_template.v[i] = vxm;
		}
		if (ghost) {
			face_template.tc0 = face_template.tc1 = face_template.tc2 = 0;
			face_template.n0 = face_template.n1 = face_template.n2 =
					uint32_t(m_normals.size() & UINT32_MAX);
			face_template.sector = it->sector;
			face_template.surface.set(0, 0, it->material, RSF_COLLISION|RSF_AUTOMATIC);
			m_faces.push_back(face_template);
			m_normals.push_back(fvector3().calc_normal(m_points[face_template.v0],
					m_points[face_template.v1], m_points[face_template.v2]));
		}
	}
	delete[] cf2m;
	if (num_normals != m_normals.size()) {
		remove_back_faces(1e-3f);

		uint32_t tc_base = uint32_t(m_texcoords.size() & UINT32_MAX);
		m_texcoords.push_back(fvector2().set(0.f, 0.f));
		m_texcoords.push_back(fvector2().set(0.f, 1.f));
		m_texcoords.push_back(fvector2().set(1.f, 0.f));

		for (b_face_vec_it it = m_faces.begin() + num_faces, end = m_faces.end(); it != end; ++it) {
			if (it->n0 >= num_normals) {
				it->tc0 = tc_base;
				it->tc1 = tc_base + 1;
				it->tc2 = tc_base + 2;
			}
		}
	}
}